

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMerge.c
# Opt level: O0

void Abc_NtkCollectCircle(Vec_Ptr_t *vStart,Vec_Ptr_t *vNext,int nFanMax)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pAVar2;
  int local_38;
  int local_34;
  int k;
  int i;
  Abc_Obj_t *pNext;
  Abc_Obj_t *pObj;
  int nFanMax_local;
  Vec_Ptr_t *vNext_local;
  Vec_Ptr_t *vStart_local;
  
  Vec_PtrClear(vNext);
  for (local_34 = 0; iVar1 = Vec_PtrSize(vStart), local_34 < iVar1; local_34 = local_34 + 1) {
    pObj_00 = (Abc_Obj_t *)Vec_PtrEntry(vStart,local_34);
    for (local_38 = 0; iVar1 = Abc_ObjFaninNum(pObj_00), local_38 < iVar1; local_38 = local_38 + 1)
    {
      pAVar2 = Abc_ObjFanin(pObj_00,local_38);
      iVar1 = Abc_ObjIsNode(pAVar2);
      if ((iVar1 != 0) && (iVar1 = Abc_NodeIsTravIdCurrent(pAVar2), iVar1 == 0)) {
        Abc_NodeSetTravIdCurrent(pAVar2);
        Vec_PtrPush(vNext,pAVar2);
      }
    }
    for (local_38 = 0; iVar1 = Abc_ObjFanoutNum(pObj_00), local_38 < iVar1; local_38 = local_38 + 1)
    {
      pAVar2 = Abc_ObjFanout(pObj_00,local_38);
      iVar1 = Abc_ObjIsNode(pAVar2);
      if ((iVar1 != 0) && (iVar1 = Abc_NodeIsTravIdCurrent(pAVar2), iVar1 == 0)) {
        Abc_NodeSetTravIdCurrent(pAVar2);
        iVar1 = Abc_ObjFanoutNum(pAVar2);
        if (iVar1 <= nFanMax) {
          Vec_PtrPush(vNext,pAVar2);
        }
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkCollectCircle( Vec_Ptr_t * vStart, Vec_Ptr_t * vNext, int nFanMax )
{
    Abc_Obj_t * pObj, * pNext;
    int i, k;
    Vec_PtrClear( vNext );
    Vec_PtrForEachEntry( Abc_Obj_t *, vStart, pObj, i )
    {
        Abc_ObjForEachFanin( pObj, pNext, k )
        {
            if ( !Abc_ObjIsNode(pNext) )
                continue;
            if ( Abc_NodeIsTravIdCurrent( pNext ) )
                continue;
            Abc_NodeSetTravIdCurrent( pNext );
            Vec_PtrPush( vNext, pNext );
        }
        Abc_ObjForEachFanout( pObj, pNext, k )
        {
            if ( !Abc_ObjIsNode(pNext) )
                continue;
            if ( Abc_NodeIsTravIdCurrent( pNext ) )
                continue;
            Abc_NodeSetTravIdCurrent( pNext );
            if ( Abc_ObjFanoutNum(pNext) > nFanMax )
                continue;
            Vec_PtrPush( vNext, pNext );
        }
    }
}